

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

void __thiscall Memory::Recycler::CheckAllocExternalMark(Recycler *this)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  CollectionState CVar4;
  undefined4 *puVar5;
  ThreadContextId pvVar6;
  Recycler *this_local;
  
  if ((this->disableThreadAccessCheck & 1U) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x82c,"(!disableThreadAccessCheck)","!disableThreadAccessCheck");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pvVar6 = GetCurrentThreadContextId();
  if (pvVar6 != this->mainThreadId) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x82d,"(GetCurrentThreadContextId() == mainThreadId)",
                       "GetCurrentThreadContextId() == mainThreadId");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  BVar3 = IsMarkState(this);
  if ((BVar3 != 0) &&
     (CVar4 = ObservableValue::operator_cast_to_CollectionState
                        ((ObservableValue *)&this->collectionState),
     CVar4 != CollectionStateConcurrentMark)) {
    return;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar5 = 1;
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                     ,0x832,
                     "(this->IsMarkState() && collectionState != CollectionStateConcurrentMark)",
                     "this->IsMarkState() && collectionState != CollectionStateConcurrentMark");
  if (bVar2) {
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
    return;
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void
Recycler::CheckAllocExternalMark() const
{
    Assert(!disableThreadAccessCheck);
    Assert(GetCurrentThreadContextId() == mainThreadId);
#if ENABLE_CONCURRENT_GC
  #ifdef HEAP_ENUMERATION_VALIDATION
    Assert((this->IsMarkState() || this->IsPostEnumHeapValidationInProgress()) && collectionState != CollectionStateConcurrentMark);
  #else
    Assert(this->IsMarkState()  && collectionState != CollectionStateConcurrentMark);
  #endif
#else
    Assert(this->IsMarkState());
#endif
}